

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

void __thiscall Tools::Tools(Tools *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a5;
  undefined1 local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178 [32];
  string local_158 [32];
  iterator local_138;
  size_type local_130;
  undefined1 local_126;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_125 [2];
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  string local_d8 [32];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a6;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a5 [2];
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  allocator<char> local_11;
  Tools *local_10;
  Tools *this_local;
  
  local_10 = this;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1);
  this->files = pvVar1;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1);
  this->words = pvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->mainBranch,"master",&local_11)
  ;
  std::allocator<char>::~allocator(&local_11);
  std::__cxx11::string::string((string *)&this->currentBranch,(string *)&this->mainBranch);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  local_a6 = '\x01';
  local_a5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )0x1;
  local_a1._1_8_ = &local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"init",local_a1);
  local_a1._1_8_ = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"add",&local_a2);
  local_a1._1_8_ = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"commit",&local_a3);
  local_a5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )0x0;
  local_38 = &local_98;
  local_30 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_a5);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1,__l_01,local_a5);
  local_a6 = '\0';
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_a5);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_240 = local_240 + -1;
    std::__cxx11::string::~string((string *)local_240);
  } while (local_240 != &local_98);
  std::allocator<char>::~allocator(&local_a3);
  std::allocator<char>::~allocator(&local_a2);
  std::allocator<char>::~allocator(local_a1);
  this->operations = pvVar1;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  local_126 = '\x01';
  local_125[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x1;
  local_121._1_8_ = &local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"objects",local_121);
  local_121._1_8_ = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"versions",&local_122);
  local_121._1_8_ = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"logs",&local_123);
  local_125[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0;
  local_b8 = &local_118;
  local_b0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_125);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1,__l_00,local_125);
  local_126 = '\0';
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_125);
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
  do {
    local_2a0 = local_2a0 + -1;
    std::__cxx11::string::~string((string *)local_2a0);
  } while (local_2a0 != &local_118);
  std::allocator<char>::~allocator(&local_123);
  std::allocator<char>::~allocator(&local_122);
  std::allocator<char>::~allocator(local_121);
  this->subDirs = pvVar1;
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  local_1a4 = 1;
  local_1a0 = &local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"Index",&local_1a1);
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"Current_branch",&local_1a2);
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"Branches",&local_1a3);
  local_1a4 = 0;
  local_138 = &local_198;
  local_130 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1a5);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1,__l,&local_1a5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1a5);
  local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_300 = local_300 + -1;
    std::__cxx11::string::~string((string *)local_300);
  } while (local_300 != &local_198);
  std::allocator<char>::~allocator(&local_1a3);
  std::allocator<char>::~allocator(&local_1a2);
  std::allocator<char>::~allocator(&local_1a1);
  this->fileNames = pvVar1;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  GetCurrentPath_abi_cxx11_(__return_storage_ptr__,this);
  this->path = __return_storage_ptr__;
  return;
}

Assistant:

Tools() {}